

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool r_exec::match(IPGMContext *input,IPGMContext *pattern,IPGMContext *productions,
                  vector<unsigned_short,_std::allocator<unsigned_short>_> *production_indices)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  uint16_t i;
  ushort index;
  uint16_t local_da;
  uint16_t production_index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_c8;
  IPGMContext prod;
  IPGMContext local_90;
  uint16_t unused_index;
  
  local_90.super__Context.overlay = (Overlay *)0x0;
  local_90.super__Context.code = (Atom *)0x0;
  local_90.super__Context.index = 0;
  local_90.super__Context.data = UNDEFINED;
  local_90.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
  local_90.object = (Code *)0x0;
  local_90.view = (View *)0x0;
  local_c8 = production_indices;
  sVar2 = r_code::Atom::asOpcode();
  if (sVar2 == Opcodes::Ptn) {
    IPGMContext::getChild((IPGMContext *)&unused_index,pattern,1);
    IPGMContext::operator*(&prod,(IPGMContext *)&unused_index);
    local_90.object = prod.object;
    local_90.view = prod.view;
    local_90.super__Context.code = prod.super__Context.code;
    local_90.super__Context.index = prod.super__Context.index;
    local_90.super__Context.data = prod.super__Context.data;
    bVar1 = IPGMContext::match(&local_90,input);
    if (bVar1) {
      local_da = _Context::get_last_patch_index(&pattern->super__Context);
      bVar1 = match(input,pattern);
      if (bVar1) {
LAB_0017351c:
        iVar3 = (*(productions->super__Context)._vptr__Context[6])(productions);
        for (index = 1; index <= (ushort)iVar3; index = index + 1) {
          IPGMContext::getChild(&prod,productions,index);
          IPGMContext::evaluate(&prod,&unused_index);
          IPGMContext::copy_to_value_array(&prod,&production_index);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (local_c8,&production_index);
        }
        _Context::unpatch_code(&pattern->super__Context,local_da);
        return true;
      }
    }
  }
  else {
    sVar2 = r_code::Atom::asOpcode();
    if (sVar2 == Opcodes::AntiPtn) {
      IPGMContext::getChild((IPGMContext *)&unused_index,pattern,1);
      IPGMContext::operator*(&prod,(IPGMContext *)&unused_index);
      local_90.object = prod.object;
      local_90.view = prod.view;
      local_90.super__Context.code = prod.super__Context.code;
      local_90.super__Context.index = prod.super__Context.index;
      local_90.super__Context.data = prod.super__Context.data;
      bVar1 = IPGMContext::match(&local_90,input);
      if (!bVar1) {
        local_da = _Context::get_last_patch_index(&pattern->super__Context);
        bVar1 = match(input,pattern);
        if (!bVar1) goto LAB_0017351c;
      }
    }
  }
  return false;
}

Assistant:

bool match(const IPGMContext &input, const IPGMContext &pattern, const IPGMContext &productions, std::vector<uint16_t> &production_indices)
{
    IPGMContext skeleton = IPGMContext();
    uint16_t last_patch_index;

    if (pattern[0].asOpcode() == Opcodes::Ptn) {
        skeleton = *pattern.getChild(1);

        if (!skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (!match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    if (pattern[0].asOpcode() == Opcodes::AntiPtn) {
        skeleton = *pattern.getChild(1);

        if (skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    return false;
build_productions:
    // compute all productions for this input.
    uint16_t production_count = productions.getChildrenCount();
    uint16_t unused_index;
    uint16_t production_index;

    for (uint16_t i = 1; i <= production_count; ++i) {
        IPGMContext prod = productions.getChild(i);
        //prod.trace();
        prod.evaluate(unused_index);
        prod.copy_to_value_array(production_index);
        production_indices.push_back(production_index);
    }

    pattern.unpatch_code(last_patch_index);
    return true;
}